

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Header.cpp
# Opt level: O0

PROCESSOR_TYPE __thiscall ezc3d::Header::readProcessorType(Header *this,c3d *c3d,fstream *file)

{
  size_t sVar1;
  runtime_error *this_00;
  undefined8 in_RDX;
  undefined1 auVar2 [16];
  size_t processorType;
  size_t parametersAddress;
  streampos dataPos;
  seekdir *in_stack_ffffffffffffffb0;
  undefined8 in_stack_ffffffffffffffb8;
  fstream *in_stack_ffffffffffffffc0;
  undefined8 in_stack_ffffffffffffffc8;
  PROCESSOR_TYPE processorType_00;
  c3d *this_01;
  PROCESSOR_TYPE local_4;
  
  processorType_00 = (PROCESSOR_TYPE)((ulong)in_stack_ffffffffffffffc8 >> 0x20);
  auVar2 = std::istream::tellg();
  this_01 = auVar2._0_8_;
  sVar1 = ezc3d::c3d::readUint
                    (this_01,processorType_00,in_stack_ffffffffffffffc0,
                     (uint)((ulong)in_stack_ffffffffffffffb8 >> 0x20),(int)in_stack_ffffffffffffffb8
                     ,in_stack_ffffffffffffffb0);
  sVar1 = ezc3d::c3d::readUint
                    (this_01,(PROCESSOR_TYPE)(sVar1 >> 0x20),in_stack_ffffffffffffffc0,
                     (uint)((ulong)in_stack_ffffffffffffffb8 >> 0x20),(int)in_stack_ffffffffffffffb8
                     ,in_stack_ffffffffffffffb0);
  std::istream::seekg(in_RDX,this_01,auVar2._8_8_);
  if (sVar1 == 0x54) {
    local_4 = INTEL;
  }
  else if (sVar1 == 0x55) {
    local_4 = DEC;
  }
  else {
    if (sVar1 != 0x56) {
      this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
      std::runtime_error::runtime_error(this_00,"Could not read the processor type");
      __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
    }
    local_4 = MIPS;
  }
  return local_4;
}

Assistant:

ezc3d::PROCESSOR_TYPE ezc3d::Header::readProcessorType(c3d &c3d,
                                                       std::fstream &file) {
  // Remember the current position of the cursor
  std::streampos dataPos = file.tellg();

  // Read the processor type (assuming Intel type)
  size_t parametersAddress(c3d.readUint(PROCESSOR_TYPE::INTEL, file,
                                        1 * ezc3d::DATA_TYPE::BYTE, 0,
                                        std::ios::beg));
  size_t processorType = c3d.readUint(
      PROCESSOR_TYPE::INTEL, file, 1 * ezc3d::DATA_TYPE::BYTE,
      static_cast<int>(256 * ezc3d::DATA_TYPE::WORD * (parametersAddress - 1)) +
          3 * ezc3d::DATA_TYPE::BYTE,
      std::ios::beg);

  // Put back the cursor in the file
  file.seekg(dataPos);

  if (processorType == 84)
    return ezc3d::PROCESSOR_TYPE::INTEL;
  else if (processorType == 85)
    return ezc3d::PROCESSOR_TYPE::DEC;
  else if (processorType == 86)
    return ezc3d::PROCESSOR_TYPE::MIPS;
  else
    throw std::runtime_error("Could not read the processor type");
}